

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::Var::Var(Var *this,Generator *module,string *name,uint32_t var_width,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *size,bool is_signed)

{
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,size);
  Var(this,module,name,var_width,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
      is_signed,Base);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

Var::Var(Generator *module, const std::string &name, uint32_t var_width,
         const std::vector<uint32_t> &size, bool is_signed)
    : Var(module, name, var_width, size, is_signed, VarType::Base) {}